

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteMethodDocComment
               (Printer *printer,MethodDescriptor *method)

{
  string local_78;
  string local_58;
  string local_38;
  MethodDescriptor *local_18;
  MethodDescriptor *method_local;
  Printer *printer_local;
  
  local_18 = method;
  method_local = (MethodDescriptor *)printer;
  MethodDescriptor::DebugString_abi_cxx11_(&local_78,method);
  FirstLineOf(&local_58,&local_78);
  EscapeJavadoc(&local_38,&local_58);
  io::Printer::Print(printer,"/**\n * <code>$def$</code>\n","def",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  WriteDocCommentBody<google::protobuf::MethodDescriptor>((Printer *)method_local,local_18);
  io::Printer::Print((Printer *)method_local," */\n");
  return;
}

Assistant:

void WriteMethodDocComment(io::Printer* printer,
                           const MethodDescriptor* method) {
  printer->Print(
    "/**\n"
    " * <code>$def$</code>\n",
    "def", EscapeJavadoc(FirstLineOf(method->DebugString())));
  WriteDocCommentBody(printer, method);
  printer->Print(" */\n");
}